

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

void PredictorAdd12_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint32_t uVar4;
  char cVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  char cVar40;
  undefined1 auVar41 [15];
  unkuint9 Var42;
  undefined1 auVar43 [11];
  undefined1 auVar44 [15];
  unkuint9 Var45;
  undefined1 auVar46 [11];
  ushort uVar47;
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined3 uVar60;
  undefined8 uVar61;
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  uint uVar66;
  undefined5 uVar67;
  undefined1 auVar68 [12];
  undefined8 uVar69;
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [14];
  undefined8 uVar74;
  undefined1 auVar75 [14];
  undefined1 auVar76 [14];
  undefined1 auVar77 [14];
  long lVar78;
  long lVar79;
  byte bVar80;
  short sVar81;
  char cVar85;
  char cVar86;
  short sVar87;
  char cVar88;
  char cVar89;
  short sVar90;
  char cVar91;
  char cVar92;
  short sVar93;
  byte bVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  undefined1 auVar84 [16];
  short sVar98;
  undefined4 uVar99;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  undefined4 uVar107;
  undefined4 uVar108;
  char cVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  undefined2 uVar82;
  undefined4 uVar83;
  char cVar100;
  char cVar101;
  char cVar102;
  char cVar109;
  char cVar110;
  char cVar111;
  
  uVar4 = out[-1];
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(uVar4 
                                                  >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar4 >> 0x10),uVar4)) >> 0x20),
                                                  uVar4) >> 0x18),
                                       CONCAT12((char)(uVar4 >> 8),(short)uVar4)) >> 0x10),
                       (short)uVar4) & 0xffff00ff00ff00ff;
  lVar78 = 0;
  lVar79 = 0;
  while (lVar79 + 4 <= (long)num_pixels) {
    pcVar1 = (char *)((long)in + lVar78);
    cVar5 = pcVar1[8];
    cVar109 = pcVar1[9];
    cVar110 = pcVar1[10];
    cVar111 = pcVar1[0xb];
    cVar40 = pcVar1[0xc];
    cVar100 = pcVar1[0xd];
    cVar101 = pcVar1[0xe];
    cVar102 = pcVar1[0xf];
    auVar2 = *(undefined1 (*) [16])((long)upper + lVar78 + -4);
    auVar3 = *(undefined1 (*) [16])((long)upper + lVar78);
    auVar6[0xd] = 0;
    auVar6._0_13_ = auVar3._0_13_;
    auVar6[0xe] = auVar3[7];
    auVar12[0xc] = auVar3[6];
    auVar12._0_12_ = auVar3._0_12_;
    auVar12._13_2_ = auVar6._13_2_;
    auVar14[0xb] = 0;
    auVar14._0_11_ = auVar3._0_11_;
    auVar14._12_3_ = auVar12._12_3_;
    auVar20[10] = auVar3[5];
    auVar20._0_10_ = auVar3._0_10_;
    auVar20._11_4_ = auVar14._11_4_;
    auVar22[9] = 0;
    auVar22._0_9_ = auVar3._0_9_;
    auVar22._10_5_ = auVar20._10_5_;
    auVar28[8] = auVar3[4];
    auVar28._0_8_ = auVar3._0_8_;
    auVar28._9_6_ = auVar22._9_6_;
    auVar41._7_8_ = 0;
    auVar41._0_7_ = auVar28._8_7_;
    Var42 = CONCAT81(SUB158(auVar41 << 0x40,7),auVar3[3]);
    auVar56._9_6_ = 0;
    auVar56._0_9_ = Var42;
    auVar43._1_10_ = SUB1510(auVar56 << 0x30,5);
    auVar43[0] = auVar3[2];
    auVar57._11_4_ = 0;
    auVar57._0_11_ = auVar43;
    auVar34[2] = auVar3[1];
    auVar34._0_2_ = auVar3._0_2_;
    auVar34._3_12_ = SUB1512(auVar57 << 0x20,3);
    auVar7[0xd] = 0;
    auVar7._0_13_ = auVar2._0_13_;
    auVar7[0xe] = auVar2[7];
    auVar13[0xc] = auVar2[6];
    auVar13._0_12_ = auVar2._0_12_;
    auVar13._13_2_ = auVar7._13_2_;
    auVar15[0xb] = 0;
    auVar15._0_11_ = auVar2._0_11_;
    auVar15._12_3_ = auVar13._12_3_;
    auVar21[10] = auVar2[5];
    auVar21._0_10_ = auVar2._0_10_;
    auVar21._11_4_ = auVar15._11_4_;
    auVar23[9] = 0;
    auVar23._0_9_ = auVar2._0_9_;
    auVar23._10_5_ = auVar21._10_5_;
    auVar29[8] = auVar2[4];
    auVar29._0_8_ = auVar2._0_8_;
    auVar29._9_6_ = auVar23._9_6_;
    auVar44._7_8_ = 0;
    auVar44._0_7_ = auVar29._8_7_;
    Var45 = CONCAT81(SUB158(auVar44 << 0x40,7),auVar2[3]);
    auVar58._9_6_ = 0;
    auVar58._0_9_ = Var45;
    auVar46._1_10_ = SUB1510(auVar58 << 0x30,5);
    auVar46[0] = auVar2[2];
    auVar59._11_4_ = 0;
    auVar59._0_11_ = auVar46;
    auVar35[2] = auVar2[1];
    auVar35._0_2_ = auVar2._0_2_;
    auVar35._3_12_ = SUB1512(auVar59 << 0x20,3);
    sVar113 = auVar28._8_2_ - auVar29._8_2_;
    sVar114 = auVar20._10_2_ - auVar21._10_2_;
    sVar115 = auVar12._12_2_ - auVar13._12_2_;
    sVar116 = (auVar6._13_2_ >> 8) - (auVar7._13_2_ >> 8);
    sVar103 = (ushort)auVar3[0xc] - (ushort)auVar2[0xc];
    sVar104 = (ushort)auVar3[0xd] - (ushort)auVar2[0xd];
    sVar105 = (ushort)auVar3[0xe] - (ushort)auVar2[0xe];
    sVar106 = (ushort)auVar3[0xf] - (ushort)auVar2[0xf];
    sVar81 = auVar84._0_2_ + ((auVar3._0_2_ & 0xff) - (auVar2._0_2_ & 0xff));
    sVar87 = auVar84._2_2_ + (auVar34._2_2_ - auVar35._2_2_);
    sVar90 = auVar84._4_2_ + (auVar43._0_2_ - auVar46._0_2_);
    sVar93 = auVar84._6_2_ + ((short)Var42 - (short)Var45);
    sVar95 = auVar84._8_2_ + sVar113;
    sVar96 = auVar84._10_2_ + sVar114;
    sVar97 = auVar84._12_2_ + sVar115;
    sVar98 = auVar84._14_2_ + sVar116;
    bVar80 = ((0 < sVar81) * (sVar81 < 0x100) * (char)sVar81 - (0xff < sVar81)) + *pcVar1;
    cVar85 = ((0 < sVar87) * (sVar87 < 0x100) * (char)sVar87 - (0xff < sVar87)) + pcVar1[1];
    uVar82 = CONCAT11(cVar85,bVar80);
    cVar86 = ((0 < sVar90) * (sVar90 < 0x100) * (char)sVar90 - (0xff < sVar90)) + pcVar1[2];
    cVar88 = ((0 < sVar93) * (sVar93 < 0x100) * (char)sVar93 - (0xff < sVar93)) + pcVar1[3];
    uVar83 = CONCAT13(cVar88,CONCAT12(cVar86,uVar82));
    cVar89 = ((0 < sVar95) * (sVar95 < 0x100) * (char)sVar95 - (0xff < sVar95)) + pcVar1[4];
    cVar91 = ((0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96)) + pcVar1[5];
    cVar92 = ((0 < sVar97) * (sVar97 < 0x100) * (char)sVar97 - (0xff < sVar97)) + pcVar1[6];
    bVar94 = ((0 < sVar98) * (sVar98 < 0x100) * (char)sVar98 - (0xff < sVar98)) + pcVar1[7];
    uVar47 = CONCAT11(((0 < sVar81) * (sVar81 < 0x100) * (char)sVar81 - (0xff < sVar81)) + cVar5,
                      bVar94);
    uVar60 = CONCAT12(((0 < sVar87) * (sVar87 < 0x100) * (char)sVar87 - (0xff < sVar87)) + cVar109,
                      uVar47);
    uVar66 = CONCAT13(((0 < sVar90) * (sVar90 < 0x100) * (char)sVar90 - (0xff < sVar90)) + cVar110,
                      uVar60);
    uVar67 = CONCAT14(((0 < sVar93) * (sVar93 < 0x100) * (char)sVar93 - (0xff < sVar93)) + cVar111,
                      uVar66);
    auVar73[5] = ((0 < sVar95) * (sVar95 < 0x100) * (char)sVar95 - (0xff < sVar95)) + cVar40;
    auVar73._0_5_ = uVar67;
    auVar73._6_8_ = 0;
    auVar8[0xe] = bVar94;
    auVar8._0_14_ = auVar73 << 0x38;
    uVar74 = CONCAT26(auVar8._13_2_,CONCAT15(cVar92,uVar67));
    auVar68._4_8_ = 0;
    auVar68._0_4_ = uVar66;
    auVar16._12_3_ = (int3)((ulong)uVar74 >> 0x28);
    auVar16._0_12_ = auVar68 << 0x38;
    uVar69 = CONCAT44(auVar16._11_4_,CONCAT13(cVar91,uVar60));
    auVar24._10_5_ = (int5)((ulong)uVar69 >> 0x18);
    auVar24._0_10_ = (unkuint10)uVar47 << 0x38;
    uVar61 = CONCAT62(auVar24._9_6_,CONCAT11(cVar89,bVar94));
    auVar48._7_8_ = 0;
    auVar48._0_7_ = (uint7)((ulong)uVar61 >> 8);
    Var42 = CONCAT81(SUB158(auVar48 << 0x40,7),cVar88);
    auVar62._9_6_ = 0;
    auVar62._0_9_ = Var42;
    auVar30[4] = cVar86;
    auVar30._0_4_ = uVar83;
    auVar30._5_10_ = SUB1510(auVar62 << 0x30,5);
    auVar49._11_4_ = 0;
    auVar49._0_11_ = auVar30._4_11_;
    auVar36[2] = cVar85;
    auVar36._0_2_ = uVar82;
    auVar36._3_12_ = SUB1512(auVar49 << 0x20,3);
    sVar113 = sVar113 + (ushort)bVar80;
    sVar114 = sVar114 + auVar36._2_2_;
    sVar115 = sVar115 + auVar30._4_2_;
    sVar116 = sVar116 + (short)Var42;
    sVar81 = (short)((ulong)uVar61 >> 8);
    sVar87 = (short)((ulong)uVar69 >> 0x18);
    sVar90 = (short)((ulong)uVar74 >> 0x28);
    bVar80 = ((0 < sVar113) * (sVar113 < 0x100) * (char)sVar113 - (0xff < sVar113)) + pcVar1[4];
    cVar85 = ((0 < sVar114) * (sVar114 < 0x100) * (char)sVar114 - (0xff < sVar114)) + pcVar1[5];
    uVar82 = CONCAT11(cVar85,bVar80);
    cVar86 = ((0 < sVar115) * (sVar115 < 0x100) * (char)sVar115 - (0xff < sVar115)) + pcVar1[6];
    cVar88 = ((0 < sVar116) * (sVar116 < 0x100) * (char)sVar116 - (0xff < sVar116)) + pcVar1[7];
    uVar107 = CONCAT13(cVar88,CONCAT12(cVar86,uVar82));
    cVar112 = ((bVar94 != 0) * (bVar94 < 0x100) * bVar94 - (0xff < bVar94)) + cVar111;
    uVar47 = CONCAT11(((0 < sVar113) * (sVar113 < 0x100) * (char)sVar113 - (0xff < sVar113)) +
                      cVar40,cVar112);
    uVar60 = CONCAT12(((0 < sVar114) * (sVar114 < 0x100) * (char)sVar114 - (0xff < sVar114)) +
                      cVar100,uVar47);
    uVar66 = CONCAT13(((0 < sVar115) * (sVar115 < 0x100) * (char)sVar115 - (0xff < sVar115)) +
                      cVar101,uVar60);
    uVar67 = CONCAT14(((0 < sVar116) * (sVar116 < 0x100) * (char)sVar116 - (0xff < sVar116)) +
                      cVar102,uVar66);
    auVar75[5] = (0 < sVar81) * (sVar81 < 0x100) * cVar89 - (0xff < sVar81);
    auVar75._0_5_ = uVar67;
    auVar75._6_8_ = 0;
    auVar9[0xe] = cVar112;
    auVar9._0_14_ = auVar75 << 0x38;
    uVar74 = CONCAT26(auVar9._13_2_,
                      CONCAT15(((0 < sVar90) * (sVar90 < 0x100) * cVar92 - (0xff < sVar90)) +
                               cVar110,uVar67));
    auVar70._4_8_ = 0;
    auVar70._0_4_ = uVar66;
    auVar17._12_3_ = (int3)((ulong)uVar74 >> 0x28);
    auVar17._0_12_ = auVar70 << 0x38;
    uVar69 = CONCAT44(auVar17._11_4_,
                      CONCAT13(((0 < sVar87) * (sVar87 < 0x100) * cVar91 - (0xff < sVar87)) +
                               cVar109,uVar60));
    auVar25._10_5_ = (int5)((ulong)uVar69 >> 0x18);
    auVar25._0_10_ = (unkuint10)uVar47 << 0x38;
    uVar61 = CONCAT62(auVar25._9_6_,
                      CONCAT11(((0 < sVar81) * (sVar81 < 0x100) * cVar89 - (0xff < sVar81)) + cVar5,
                               cVar112));
    auVar50._7_8_ = 0;
    auVar50._0_7_ = (uint7)((ulong)uVar61 >> 8);
    Var42 = CONCAT81(SUB158(auVar50 << 0x40,7),cVar88);
    auVar63._9_6_ = 0;
    auVar63._0_9_ = Var42;
    auVar31[4] = cVar86;
    auVar31._0_4_ = uVar107;
    auVar31._5_10_ = SUB1510(auVar63 << 0x30,5);
    auVar51._11_4_ = 0;
    auVar51._0_11_ = auVar31._4_11_;
    auVar37[2] = cVar85;
    auVar37._0_2_ = uVar82;
    auVar37._3_12_ = SUB1512(auVar51 << 0x20,3);
    sVar81 = (ushort)bVar80 + ((ushort)auVar3[8] - (ushort)auVar2[8]);
    sVar87 = auVar37._2_2_ + ((ushort)auVar3[9] - (ushort)auVar2[9]);
    sVar90 = auVar31._4_2_ + ((ushort)auVar3[10] - (ushort)auVar2[10]);
    sVar93 = (short)Var42 + ((ushort)auVar3[0xb] - (ushort)auVar2[0xb]);
    sVar95 = (short)((ulong)uVar61 >> 8) + sVar103;
    sVar96 = (short)((ulong)uVar69 >> 0x18) + sVar104;
    sVar97 = (short)((ulong)uVar74 >> 0x28) + sVar105;
    sVar98 = (auVar9._13_2_ >> 8) + sVar106;
    bVar80 = ((0 < sVar81) * (sVar81 < 0x100) * (char)sVar81 - (0xff < sVar81)) + cVar5;
    cVar109 = ((0 < sVar87) * (sVar87 < 0x100) * (char)sVar87 - (0xff < sVar87)) + cVar109;
    uVar82 = CONCAT11(cVar109,bVar80);
    cVar110 = ((0 < sVar90) * (sVar90 < 0x100) * (char)sVar90 - (0xff < sVar90)) + cVar110;
    cVar111 = ((0 < sVar93) * (sVar93 < 0x100) * (char)sVar93 - (0xff < sVar93)) + cVar111;
    uVar108 = CONCAT13(cVar111,CONCAT12(cVar110,uVar82));
    cVar85 = ((0 < sVar95) * (sVar95 < 0x100) * (char)sVar95 - (0xff < sVar95)) + cVar40;
    cVar86 = ((0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96)) + cVar100;
    cVar88 = ((0 < sVar97) * (sVar97 < 0x100) * (char)sVar97 - (0xff < sVar97)) + cVar101;
    bVar94 = ((0 < sVar98) * (sVar98 < 0x100) * (char)sVar98 - (0xff < sVar98)) + cVar102;
    uVar47 = CONCAT11((0 < sVar81) * (sVar81 < 0x100) * (char)sVar81 - (0xff < sVar81),bVar94);
    uVar60 = CONCAT12((0 < sVar87) * (sVar87 < 0x100) * (char)sVar87 - (0xff < sVar87),uVar47);
    uVar66 = CONCAT13((0 < sVar90) * (sVar90 < 0x100) * (char)sVar90 - (0xff < sVar90),uVar60);
    uVar67 = CONCAT14((0 < sVar93) * (sVar93 < 0x100) * (char)sVar93 - (0xff < sVar93),uVar66);
    auVar76[5] = (0 < sVar95) * (sVar95 < 0x100) * (char)sVar95 - (0xff < sVar95);
    auVar76._0_5_ = uVar67;
    auVar76._6_8_ = 0;
    auVar10[0xe] = bVar94;
    auVar10._0_14_ = auVar76 << 0x38;
    uVar74 = CONCAT26(auVar10._13_2_,CONCAT15(cVar88,uVar67));
    auVar71._4_8_ = 0;
    auVar71._0_4_ = uVar66;
    auVar18._12_3_ = (int3)((ulong)uVar74 >> 0x28);
    auVar18._0_12_ = auVar71 << 0x38;
    uVar69 = CONCAT44(auVar18._11_4_,CONCAT13(cVar86,uVar60));
    auVar26._10_5_ = (int5)((ulong)uVar69 >> 0x18);
    auVar26._0_10_ = (unkuint10)uVar47 << 0x38;
    uVar61 = CONCAT62(auVar26._9_6_,CONCAT11(cVar85,bVar94));
    auVar52._7_8_ = 0;
    auVar52._0_7_ = (uint7)((ulong)uVar61 >> 8);
    Var42 = CONCAT81(SUB158(auVar52 << 0x40,7),cVar111);
    auVar64._9_6_ = 0;
    auVar64._0_9_ = Var42;
    auVar32[4] = cVar110;
    auVar32._0_4_ = uVar108;
    auVar32._5_10_ = SUB1510(auVar64 << 0x30,5);
    auVar53._11_4_ = 0;
    auVar53._0_11_ = auVar32._4_11_;
    auVar38[2] = cVar109;
    auVar38._0_2_ = uVar82;
    auVar38._3_12_ = SUB1512(auVar53 << 0x20,3);
    sVar103 = sVar103 + (ushort)bVar80;
    sVar104 = sVar104 + auVar38._2_2_;
    sVar105 = sVar105 + auVar32._4_2_;
    sVar106 = sVar106 + (short)Var42;
    sVar81 = (short)((ulong)uVar61 >> 8);
    sVar87 = (short)((ulong)uVar69 >> 0x18);
    sVar90 = (short)((ulong)uVar74 >> 0x28);
    cVar5 = (bVar94 != 0) * (bVar94 < 0x100) * bVar94 - (0xff < bVar94);
    auVar84[0] = ((0 < sVar103) * (sVar103 < 0x100) * (char)sVar103 - (0xff < sVar103)) + cVar40;
    cVar100 = ((0 < sVar104) * (sVar104 < 0x100) * (char)sVar104 - (0xff < sVar104)) + cVar100;
    uVar82 = CONCAT11(cVar100,auVar84[0]);
    cVar101 = ((0 < sVar105) * (sVar105 < 0x100) * (char)sVar105 - (0xff < sVar105)) + cVar101;
    cVar102 = ((0 < sVar106) * (sVar106 < 0x100) * (char)sVar106 - (0xff < sVar106)) + cVar102;
    uVar99 = CONCAT13(cVar102,CONCAT12(cVar101,uVar82));
    uVar47 = CONCAT11((0 < sVar103) * (sVar103 < 0x100) * (char)sVar103 - (0xff < sVar103),cVar5);
    uVar60 = CONCAT12((0 < sVar104) * (sVar104 < 0x100) * (char)sVar104 - (0xff < sVar104),uVar47);
    uVar66 = CONCAT13((0 < sVar105) * (sVar105 < 0x100) * (char)sVar105 - (0xff < sVar105),uVar60);
    uVar67 = CONCAT14((0 < sVar106) * (sVar106 < 0x100) * (char)sVar106 - (0xff < sVar106),uVar66);
    auVar77[5] = (0 < sVar81) * (sVar81 < 0x100) * cVar85 - (0xff < sVar81);
    auVar77._0_5_ = uVar67;
    *(undefined8 *)((long)out + lVar78) = CONCAT44(uVar107,uVar83);
    ((undefined8 *)((long)out + lVar78))[1] = CONCAT44(uVar99,uVar108);
    auVar77._6_8_ = 0;
    auVar11[0xe] = cVar5;
    auVar11._0_14_ = auVar77 << 0x38;
    auVar72._4_8_ = 0;
    auVar72._0_4_ = uVar66;
    auVar19._12_3_ =
         (int3)(CONCAT26(auVar11._13_2_,
                         CONCAT15((0 < sVar90) * (sVar90 < 0x100) * cVar88 - (0xff < sVar90),uVar67)
                        ) >> 0x28);
    auVar19._0_12_ = auVar72 << 0x38;
    auVar27._10_5_ =
         (int5)(CONCAT44(auVar19._11_4_,
                         CONCAT13((0 < sVar87) * (sVar87 < 0x100) * cVar86 - (0xff < sVar87),uVar60)
                        ) >> 0x18);
    auVar27._0_10_ = (unkuint10)uVar47 << 0x38;
    auVar54._7_8_ = 0;
    auVar54._0_7_ =
         (uint7)(CONCAT62(auVar27._9_6_,
                          CONCAT11((0 < sVar81) * (sVar81 < 0x100) * cVar85 - (0xff < sVar81),cVar5)
                         ) >> 8);
    auVar65._1_8_ = SUB158(auVar54 << 0x40,7);
    auVar65[0] = cVar102;
    auVar65._9_6_ = 0;
    auVar33[4] = cVar101;
    auVar33._0_4_ = uVar99;
    auVar33._5_10_ = SUB1510(auVar65 << 0x30,5);
    auVar55._11_4_ = 0;
    auVar55._0_11_ = auVar33._4_11_;
    auVar39[2] = cVar100;
    auVar39._0_2_ = uVar82;
    auVar39._3_12_ = SUB1512(auVar55 << 0x20,3);
    auVar84[1] = 0;
    auVar84._2_13_ = auVar39._2_13_;
    auVar84[0xf] = 0;
    lVar78 = lVar78 + 0x10;
    lVar79 = lVar79 + 4;
  }
  if (num_pixels == (int)lVar79) {
    return;
  }
  (*VP8LPredictorsAdd_C[0xc])
            ((uint32_t *)((long)in + lVar78),(uint32_t *)((long)upper + lVar78),
             num_pixels - (int)lVar79,(uint32_t *)((long)out + lVar78));
  return;
}

Assistant:

static void PredictorAdd12_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  const __m128i L8 = _mm_cvtsi32_si128((int)out[-1]);
  __m128i L = _mm_unpacklo_epi8(L8, zero);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    // Load 4 pixels at a time.
    __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
    const __m128i T_hi = _mm_unpackhi_epi8(T, zero);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
    const __m128i TL_hi = _mm_unpackhi_epi8(TL, zero);
    __m128i diff_lo = _mm_sub_epi16(T_lo, TL_lo);
    __m128i diff_hi = _mm_sub_epi16(T_hi, TL_hi);
    DO_PRED12(diff_lo, 0, 0);
    DO_PRED12_SHIFT(diff_lo, 0);
    DO_PRED12(diff_lo, 1, 1);
    DO_PRED12_SHIFT(diff_lo, 1);
    DO_PRED12(diff_hi, 0, 2);
    DO_PRED12_SHIFT(diff_hi, 0);
    DO_PRED12(diff_hi, 1, 3);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[12](in + i, upper + i, num_pixels - i, out + i);
  }
}